

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall duckdb_re2::DFA::~DFA(DFA *this)

{
  void *pvVar1;
  long in_RDI;
  
  pvVar1 = *(void **)(in_RDI + 0x48);
  if (pvVar1 != (void *)0x0) {
    Workq::~Workq((Workq *)0x8208fc);
    operator_delete(pvVar1);
  }
  pvVar1 = *(void **)(in_RDI + 0x50);
  if (pvVar1 != (void *)0x0) {
    Workq::~Workq((Workq *)0x820924);
    operator_delete(pvVar1);
  }
  ClearCache(this);
  std::
  unordered_set<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::StateHash,_duckdb_re2::DFA::StateEqual,_std::allocator<duckdb_re2::DFA::State_*>_>
  ::~unordered_set((unordered_set<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::StateHash,_duckdb_re2::DFA::StateEqual,_std::allocator<duckdb_re2::DFA::State_*>_>
                    *)0x82094b);
  Mutex::~Mutex((Mutex *)0x820959);
  PODArray<int>::~PODArray((PODArray<int> *)0x820967);
  Mutex::~Mutex((Mutex *)0x820975);
  return;
}

Assistant:

DFA::~DFA() {
  delete q0_;
  delete q1_;
  ClearCache();
}